

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gears_engine.c
# Opt level: O1

int gears_engine_nb(void)

{
  int iVar1;
  list *plVar2;
  
  iVar1 = -1;
  plVar2 = &engine_list;
  do {
    plVar2 = plVar2->next;
    iVar1 = iVar1 + 1;
  } while (plVar2 != &engine_list);
  return iVar1;
}

Assistant:

int gears_engine_nb()
{
  int nb = 0;
  struct list *engine_entry = NULL;

  LIST_FOR_EACH(engine_entry, &engine_list) {
    nb++;
  }

  return nb;
}